

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O3

Array2D<unsigned_int> * __thiscall
WFC::wave_to_output(Array2D<unsigned_int> *__return_storage_ptr__,WFC *this)

{
  ulong uVar1;
  size_t sVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  Array2D<unsigned_int>::Array2D
            (__return_storage_ptr__,(ulong)(this->wave).height,(ulong)(this->wave).width);
  uVar6 = (this->wave).size;
  if (uVar6 != 0) {
    uVar1 = this->nb_patterns;
    sVar2 = (this->wave).data.width;
    puVar4 = (this->wave).data.data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      if (uVar1 != 0) {
        puVar3 = (__return_storage_ptr__->data).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = 0;
        do {
          if (puVar4[uVar7] != '\0') {
            puVar3[uVar5] = (uint)uVar7;
          }
          uVar7 = uVar7 + 1;
        } while ((uVar7 & 0xffffffff) < uVar1);
        uVar6 = (this->wave).size;
      }
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + sVar2;
    } while (uVar5 < uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<unsigned> WFC::wave_to_output() const noexcept {
  Array2D<unsigned> output_patterns(wave.height, wave.width);
  for (unsigned i = 0; i < wave.size; i++) {
    for (unsigned k = 0; k < nb_patterns; k++) {
      if (wave.get(i, k)) {
        output_patterns.data[i] = k;
      }
    }
  }
  return output_patterns;
}